

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O0

int ncnn::lstm_int8(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc_int8,
                   float *weight_xc_int8_scales,Mat *bias_c,Mat *weight_hc_int8,
                   float *weight_hc_int8_scales,Mat *weight_hr,Mat *hidden_state,Mat *cell_state,
                   Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  char cVar8;
  float *pfVar9;
  long lVar10;
  long *in_RCX;
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  long in_R8;
  long *in_R9;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  double dVar15;
  long *in_stack_00000008;
  long in_stack_00000010;
  long *in_stack_00000018;
  long *in_stack_00000020;
  long *in_stack_00000028;
  undefined8 *in_stack_00000030;
  int i_5;
  float H_1;
  float *hr;
  int q_2;
  float H;
  float cell2;
  float G_1;
  float O_1;
  float F_1;
  float I_1;
  float *gates_data_1;
  int q_1;
  float *output_data;
  float G;
  float O;
  float F;
  float I;
  char h_cont;
  int i_4;
  int Gh;
  int Oh;
  int Fh;
  int Ih;
  char xi;
  int i_3;
  int Gx;
  int Ox;
  int Fx;
  int Ix;
  float descale_hc_G;
  float descale_hc_O;
  float descale_hc_F;
  float descale_hc_I;
  float descale_xc_G;
  float descale_xc_O;
  float descale_xc_F;
  float descale_xc_I;
  char *weight_hc_int8_G;
  char *weight_hc_int8_O;
  char *weight_hc_int8_F;
  char *weight_hc_int8_I;
  char *weight_xc_int8_G;
  char *weight_xc_int8_O;
  char *weight_xc_int8_F;
  char *weight_xc_int8_I;
  float *gates_data;
  float *bias_c_G;
  float *bias_c_O;
  float *bias_c_F;
  float *bias_c_I;
  int q;
  float descale_h;
  float descale_x;
  char *hs;
  char *x_1;
  Option opt_quant_1;
  int i_1;
  float absmax_1;
  int ti;
  int t_1;
  Mat hidden_state_int8_scales;
  Mat hidden_state_int8;
  Option opt_quant;
  int i;
  float absmax;
  float *x;
  int t;
  Mat bottom_blob_int8_scales;
  Mat bottom_blob_int8;
  Mat tmp_hidden_state;
  Mat gates;
  int hidden_size;
  int num_output;
  int T;
  int size;
  int i_2;
  char *ptr;
  int size_1;
  Allocator *in_stack_fffffffffffff578;
  void **ppvVar16;
  Allocator *in_stack_fffffffffffff580;
  undefined8 in_stack_fffffffffffff588;
  int _elempack;
  Mat *in_stack_fffffffffffff590;
  int in_stack_fffffffffffff598;
  int in_stack_fffffffffffff59c;
  Mat *in_stack_fffffffffffff5a0;
  Option *in_stack_fffffffffffff678;
  Mat *in_stack_fffffffffffff680;
  Mat *in_stack_fffffffffffff688;
  Mat *in_stack_fffffffffffff690;
  int local_904;
  int local_878;
  float local_874;
  int local_864;
  int local_83c;
  int local_81c;
  int local_818;
  int local_814;
  int local_810;
  int local_80c;
  int local_804;
  int local_800;
  int local_7fc;
  int local_7f8;
  int local_7f4;
  int local_764;
  float local_6fc;
  int local_6f8;
  float local_6f4;
  int local_6f0;
  int local_6ec;
  float *local_6e8;
  int *local_6e0;
  undefined8 local_6d8;
  undefined4 local_6d0;
  long *local_6c8;
  undefined4 local_6c0;
  undefined4 local_6bc;
  undefined4 local_6b8;
  undefined4 local_6b4;
  undefined4 local_6b0;
  undefined8 local_6a8;
  void *local_6a0;
  int *local_698;
  undefined8 local_690;
  undefined4 local_688;
  long *local_680;
  undefined4 local_678;
  undefined4 local_674;
  undefined4 local_670;
  undefined4 local_66c;
  int local_668;
  undefined8 local_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined4 local_648;
  undefined4 uStack_644;
  undefined4 uStack_640;
  undefined4 uStack_63c;
  ulong local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  float local_60c;
  int local_608;
  float local_604;
  long local_600;
  int local_5f4;
  void *local_5f0;
  int *local_5e8;
  undefined8 local_5e0;
  undefined4 local_5d8;
  long *local_5d0;
  undefined4 local_5c8;
  undefined4 local_5c4;
  undefined4 local_5c0;
  undefined4 local_5bc;
  undefined4 local_5b8;
  undefined8 local_5b0;
  void *local_5a8;
  int *local_5a0;
  long local_598;
  undefined4 local_590;
  long *local_588;
  undefined4 local_580;
  int local_57c;
  undefined4 local_578;
  undefined4 local_574;
  undefined4 local_570;
  undefined8 local_568;
  void *local_560;
  int *local_558;
  undefined8 local_550;
  undefined4 local_548;
  long *local_540;
  undefined4 local_538;
  undefined4 local_534;
  undefined4 local_530;
  undefined4 local_52c;
  int local_528;
  long local_520;
  undefined4 local_518;
  void *local_508;
  int *local_500;
  long local_4f8;
  undefined4 local_4f0;
  long *local_4e8;
  undefined4 local_4e0;
  int local_4dc;
  undefined4 local_4d8;
  undefined4 local_4d4;
  int local_4d0;
  long local_4c8;
  int local_4c0;
  int local_4bc;
  int local_4b8;
  int local_4b4;
  long *local_4b0;
  long local_4a8;
  long *local_4a0;
  int local_494;
  long *local_490;
  long *local_488;
  int local_47c;
  void **local_478;
  float **local_470;
  void **local_460;
  void **local_450;
  void **local_440;
  void **local_430;
  void **local_420;
  void **local_410;
  void **local_408;
  int local_3fc;
  undefined4 local_3ec;
  undefined4 local_3dc;
  undefined4 local_3cc;
  undefined4 local_3bc;
  int local_3ac;
  long *local_3a8;
  undefined8 local_3a0;
  undefined8 local_398;
  int local_390;
  undefined4 local_38c;
  void **local_388;
  int local_37c;
  void **local_378;
  int local_36c;
  long *local_368;
  int local_35c;
  void **local_358;
  int local_340;
  undefined4 local_33c;
  void **local_338;
  int local_320;
  undefined4 local_31c;
  void **local_318;
  int local_300;
  undefined4 local_2fc;
  void **local_2f8;
  int local_2e0;
  undefined4 local_2dc;
  void **local_2d8;
  int local_2c0;
  undefined4 local_2bc;
  void **local_2b8;
  int local_2a0;
  undefined4 local_29c;
  float **local_298;
  float *local_290;
  void *local_280;
  void *local_270;
  void *local_260;
  void *local_250;
  void *local_240;
  void **local_230;
  void **local_228;
  undefined8 local_220;
  undefined4 local_214;
  undefined8 local_210;
  int local_208;
  int local_204;
  void **local_200;
  undefined8 local_1f8;
  undefined4 local_1ec;
  undefined8 local_1e8;
  int local_1dc;
  void **local_1d8;
  undefined8 local_1d0;
  undefined4 local_1c4;
  undefined8 local_1c0;
  int local_1b4;
  void **local_1b0;
  undefined8 local_1a8;
  undefined4 local_19c;
  undefined8 local_198;
  undefined4 local_18c;
  float **local_188;
  long local_180;
  long local_170;
  void **local_168;
  long local_160;
  void **local_158;
  long local_150;
  long local_140;
  long local_130;
  undefined8 local_120;
  float **local_118;
  long local_110;
  void **local_108;
  undefined8 local_100;
  float **local_f8;
  undefined8 local_f0;
  float **local_e8;
  long local_e0;
  long local_d0;
  void **local_c8;
  int local_bc;
  void *local_b8;
  int local_b0;
  undefined1 local_a9;
  void **local_a8;
  void **local_a0;
  int local_94;
  void **local_90;
  void **local_88;
  int local_7c;
  int local_6c;
  int local_5c;
  int local_4c;
  int local_3c;
  int local_2c;
  int local_1c;
  int local_c;
  
  local_4b4 = *(int *)((long)in_RDI + 0x2c);
  local_4b8 = (int)in_RDI[6];
  local_4bc = *(int *)((long)in_RSI + 0x2c);
  local_4c0 = *(int *)((long)in_stack_00000028 + 0x2c);
  local_3a0 = in_stack_00000030[2];
  local_388 = &local_508;
  local_38c = 4;
  local_398 = 4;
  local_508 = (void *)0x0;
  local_500 = (int *)0x0;
  local_4f8 = 0;
  local_4f0 = 0;
  local_4e8 = (long *)0x0;
  local_4e0 = 0;
  local_4dc = 0;
  local_4d8 = 0;
  local_4d4 = 0;
  local_4d0 = 0;
  local_4c8 = 0;
  local_4b0 = in_R9;
  local_4a8 = in_R8;
  local_4a0 = in_RCX;
  local_494 = in_EDX;
  local_490 = in_RSI;
  local_488 = in_RDI;
  local_390 = local_4c0;
  Mat::create(in_stack_fffffffffffff590,(int)((ulong)in_stack_fffffffffffff588 >> 0x20),
              (int)in_stack_fffffffffffff588,(size_t)in_stack_fffffffffffff580,
              in_stack_fffffffffffff578);
  local_408 = &local_508;
  if (local_508 != (void *)0x0) {
    local_230 = local_408;
  }
  if (local_508 == (void *)0x0 || local_4c8 * local_4d0 == 0) {
    local_47c = -100;
    local_518 = 1;
    goto LAB_010754e2;
  }
  local_478 = &local_560;
  local_560 = (void *)0x0;
  local_558 = (int *)0x0;
  local_550 = 0;
  local_548 = 0;
  local_540 = (long *)0x0;
  local_538 = 0;
  local_534 = 0;
  local_530 = 0;
  local_52c = 0;
  local_528 = 0;
  local_520 = 0;
  if (local_4bc == local_4c0) {
LAB_01072ec0:
    local_220 = in_stack_00000030[2];
    local_200 = &local_5a8;
    local_204 = local_4b4;
    local_208 = local_4b8;
    local_210 = 1;
    local_214 = 1;
    local_5a8 = (void *)0x0;
    local_5a0 = (int *)0x0;
    local_598 = 0;
    local_590 = 0;
    local_588 = (long *)0x0;
    local_580 = 0;
    local_57c = 0;
    local_578 = 0;
    local_574 = 0;
    local_570 = 0;
    local_568 = 0;
    Mat::create(in_stack_fffffffffffff5a0,in_stack_fffffffffffff59c,in_stack_fffffffffffff598,
                (size_t)in_stack_fffffffffffff590,(int)((ulong)in_stack_fffffffffffff588 >> 0x20),
                in_stack_fffffffffffff580);
    local_1f8 = in_stack_00000030[2];
    local_1d8 = &local_5f0;
    local_1dc = local_4b8;
    local_1e8 = 4;
    local_1ec = 1;
    local_5f0 = (void *)0x0;
    local_5e8 = (int *)0x0;
    local_5e0 = 0;
    local_5d8 = 0;
    local_5d0 = (long *)0x0;
    local_5c8 = 0;
    local_5c4 = 0;
    local_5c0 = 0;
    local_5bc = 0;
    local_5b8 = 0;
    local_5b0 = 0;
    Mat::create(in_stack_fffffffffffff5a0,in_stack_fffffffffffff59c,
                (size_t)in_stack_fffffffffffff590,(int)((ulong)in_stack_fffffffffffff588 >> 0x20),
                in_stack_fffffffffffff580);
    for (local_5f4 = 0; _elempack = (int)((ulong)in_stack_fffffffffffff588 >> 0x20),
        local_5f4 < local_4b8; local_5f4 = local_5f4 + 1) {
      local_3a8 = local_488;
      local_3ac = local_5f4;
      local_600 = *local_488 +
                  (long)*(int *)((long)local_488 + 0x2c) * (long)local_5f4 * local_488[2];
      local_604 = 0.0;
      for (local_608 = 0; local_608 < local_4b4; local_608 = local_608 + 1) {
        dVar15 = std::fabs((double)(ulong)*(uint *)(local_600 + (long)local_608 * 4));
        local_60c = SUB84(dVar15,0);
        pfVar9 = std::max<float>(&local_604,&local_60c);
        local_604 = *pfVar9;
      }
      local_d0 = (long)local_5f4;
      local_c8 = &local_5f0;
      *(float *)((long)local_5f0 + local_d0 * 4) = 127.0 / local_604;
    }
    local_658 = *in_stack_00000030;
    local_648 = *(undefined4 *)(in_stack_00000030 + 2);
    uStack_644 = *(undefined4 *)((long)in_stack_00000030 + 0x14);
    uStack_640 = *(undefined4 *)(in_stack_00000030 + 3);
    uStack_63c = *(undefined4 *)((long)in_stack_00000030 + 0x1c);
    uStack_630 = in_stack_00000030[5];
    local_628 = in_stack_00000030[6];
    uStack_620 = in_stack_00000030[7];
    uStack_650 = in_stack_00000030[2];
    local_638 = in_stack_00000030[4] & 0xffffffffffffff;
    quantize_to_int8(in_stack_fffffffffffff690,in_stack_fffffffffffff688,in_stack_fffffffffffff680,
                     in_stack_fffffffffffff678);
    local_1d0 = in_stack_00000030[2];
    local_1b0 = &local_6a0;
    local_1b4 = local_4bc;
    local_1c0 = 1;
    local_1c4 = 1;
    local_6a0 = (void *)0x0;
    local_698 = (int *)0x0;
    local_690 = 0;
    local_688 = 0;
    local_680 = (long *)0x0;
    local_678 = 0;
    local_674 = 0;
    local_670 = 0;
    local_66c = 0;
    local_668 = 0;
    local_660 = 0;
    Mat::create(in_stack_fffffffffffff5a0,in_stack_fffffffffffff59c,
                (size_t)in_stack_fffffffffffff590,_elempack,in_stack_fffffffffffff580);
    local_1a8 = in_stack_00000030[2];
    local_188 = &local_6e8;
    local_18c = 1;
    local_198 = 4;
    local_19c = 1;
    local_6e8 = (float *)0x0;
    local_6e0 = (int *)0x0;
    local_6d8 = 0;
    local_6d0 = 0;
    local_6c8 = (long *)0x0;
    local_6c0 = 0;
    local_6bc = 0;
    local_6b8 = 0;
    local_6b4 = 0;
    local_6b0 = 0;
    local_6a8 = 0;
    Mat::create(in_stack_fffffffffffff5a0,in_stack_fffffffffffff59c,
                (size_t)in_stack_fffffffffffff590,_elempack,in_stack_fffffffffffff580);
    for (local_6ec = 0; local_6ec < local_4b8; local_6ec = local_6ec + 1) {
      if (local_494 == 0) {
        local_904 = local_6ec;
      }
      else {
        local_904 = (local_4b8 + -1) - local_6ec;
      }
      local_6f0 = local_904;
      local_6f4 = 0.0;
      for (local_6f8 = 0; local_6f8 < local_4bc; local_6f8 = local_6f8 + 1) {
        local_e0 = (long)local_6f8;
        dVar15 = std::fabs((double)(ulong)*(uint *)(*in_stack_00000020 + local_e0 * 4));
        local_6fc = SUB84(dVar15,0);
        pfVar9 = std::max<float>(&local_6f4,&local_6fc);
        local_6f4 = *pfVar9;
      }
      if ((local_6f4 != 0.0) || (NAN(local_6f4))) {
        local_f8 = &local_6e8;
        local_100 = 0;
        *local_6e8 = 127.0 / local_6f4;
        quantize_to_int8(in_stack_fffffffffffff690,in_stack_fffffffffffff688,
                         in_stack_fffffffffffff680,in_stack_fffffffffffff678);
      }
      else {
        local_e8 = &local_6e8;
        local_f0 = 0;
        *local_6e8 = 1.0;
        local_a8 = &local_6a0;
        local_a9 = 0;
        local_b0 = (int)local_660 * local_668;
        local_b8 = local_6a0;
        for (local_bc = 0; local_a0 = local_a8, local_bc < local_b0; local_bc = local_bc + 1) {
          *(undefined1 *)((long)local_6a0 + (long)local_bc) = 0;
        }
      }
      local_90 = &local_5a8;
      local_94 = local_6f0;
      local_88 = &local_6a0;
      local_110 = (long)local_6f0;
      local_108 = &local_5f0;
      fVar11 = 1.0 / *(float *)((long)local_5f0 + local_110 * 4);
      local_118 = &local_6e8;
      local_120 = 0;
      fVar12 = 1.0 / *local_6e8;
      for (local_764 = 0; local_764 < local_4c0; local_764 = local_764 + 1) {
        local_3bc = 0;
        local_3cc = 1;
        in_stack_fffffffffffff690 =
             (Mat *)(*local_4b0 + (long)*(int *)((long)local_4b0 + 0x2c) * local_4b0[2]);
        local_3dc = 2;
        in_stack_fffffffffffff688 =
             (Mat *)(*local_4b0 + (long)*(int *)((long)local_4b0 + 0x2c) * 2 * local_4b0[2]);
        local_3ec = 3;
        in_stack_fffffffffffff680 =
             (Mat *)(*local_4b0 + (long)*(int *)((long)local_4b0 + 0x2c) * 3 * local_4b0[2]);
        local_35c = local_764;
        local_358 = &local_508;
        in_stack_fffffffffffff678 =
             (Option *)((long)local_508 + (long)local_4dc * (long)local_764 * local_4f8);
        local_c = local_764;
        local_1c = local_4c0 + local_764;
        local_2c = local_4c0 * 2 + local_764;
        local_3c = local_4c0 * 3 + local_764;
        local_4c = local_764;
        local_5c = local_4c0 + local_764;
        local_6c = local_4c0 * 2 + local_764;
        local_7c = local_4c0 * 3 + local_764;
        fVar14 = *(float *)(local_4a8 + (long)(local_4c0 + local_764) * 4);
        fVar13 = *(float *)(local_4a8 + (long)(local_4c0 * 2 + local_764) * 4);
        fVar1 = *(float *)(local_4a8 + (long)(local_4c0 * 3 + local_764) * 4);
        fVar2 = *(float *)(in_stack_00000010 + (long)(local_4c0 + local_764) * 4);
        fVar3 = *(float *)(in_stack_00000010 + (long)(local_4c0 * 2 + local_764) * 4);
        fVar4 = *(float *)(in_stack_00000010 + (long)(local_4c0 * 3 + local_764) * 4);
        local_7f4 = 0;
        local_7f8 = 0;
        local_7fc = 0;
        local_800 = 0;
        for (local_804 = 0; local_804 < local_4b4; local_804 = local_804 + 1) {
          cVar8 = *(char *)((long)local_5a8 +
                           (long)local_804 + (long)local_57c * (long)local_6f0 * local_598);
          local_7f4 = (int)*(char *)(*local_4a0 +
                                     (long)*(int *)((long)local_4a0 + 0x2c) * (long)local_764 *
                                     local_4a0[2] + (long)local_804) * (int)cVar8 + local_7f4;
          local_7f8 = (int)*(char *)(*local_4a0 +
                                     (long)*(int *)((long)local_4a0 + 0x2c) * (long)local_1c *
                                     local_4a0[2] + (long)local_804) * (int)cVar8 + local_7f8;
          local_7fc = (int)*(char *)(*local_4a0 +
                                     (long)*(int *)((long)local_4a0 + 0x2c) * (long)local_2c *
                                     local_4a0[2] + (long)local_804) * (int)cVar8 + local_7fc;
          local_800 = (int)*(char *)(*local_4a0 +
                                     (long)*(int *)((long)local_4a0 + 0x2c) * (long)local_3c *
                                     local_4a0[2] + (long)local_804) * (int)cVar8 + local_800;
        }
        local_80c = 0;
        local_810 = 0;
        local_814 = 0;
        local_818 = 0;
        for (local_81c = 0; local_81c < local_4bc; local_81c = local_81c + 1) {
          cVar8 = *(char *)((long)local_6a0 + (long)local_81c);
          local_80c = (int)*(char *)(*in_stack_00000008 +
                                     (long)*(int *)((long)in_stack_00000008 + 0x2c) *
                                     (long)local_764 * in_stack_00000008[2] + (long)local_81c) *
                      (int)cVar8 + local_80c;
          local_810 = (int)*(char *)(*in_stack_00000008 +
                                     (long)*(int *)((long)in_stack_00000008 + 0x2c) * (long)local_5c
                                     * in_stack_00000008[2] + (long)local_81c) * (int)cVar8 +
                      local_810;
          local_814 = (int)*(char *)(*in_stack_00000008 +
                                     (long)*(int *)((long)in_stack_00000008 + 0x2c) * (long)local_6c
                                     * in_stack_00000008[2] + (long)local_81c) * (int)cVar8 +
                      local_814;
          local_818 = (int)*(char *)(*in_stack_00000008 +
                                     (long)*(int *)((long)in_stack_00000008 + 0x2c) * (long)local_7c
                                     * in_stack_00000008[2] + (long)local_81c) * (int)cVar8 +
                      local_818;
        }
        fVar5 = *(float *)((long)&in_stack_fffffffffffff690->data + (long)local_764 * 4);
        fVar6 = *(float *)((long)&in_stack_fffffffffffff688->data + (long)local_764 * 4);
        fVar7 = *(float *)((long)&in_stack_fffffffffffff680->data + (long)local_764 * 4);
        *(float *)in_stack_fffffffffffff678 =
             *(float *)(*local_4b0 + (long)local_764 * 4) +
             (float)local_7f4 * fVar11 * (1.0 / *(float *)(local_4a8 + (long)local_764 * 4)) +
             (float)local_80c * fVar12 * (1.0 / *(float *)(in_stack_00000010 + (long)local_764 * 4))
        ;
        in_stack_fffffffffffff678->num_threads =
             (int)(fVar5 + (float)local_7f8 * fVar11 * (1.0 / fVar14) +
                  (float)local_810 * fVar12 * (1.0 / fVar2));
        *(float *)&in_stack_fffffffffffff678->blob_allocator =
             fVar6 + (float)local_7fc * fVar11 * (1.0 / fVar13) +
             (float)local_814 * fVar12 * (1.0 / fVar3);
        *(float *)((long)&in_stack_fffffffffffff678->blob_allocator + 4) =
             fVar7 + (float)local_800 * fVar11 * (1.0 / fVar1) +
             (float)local_818 * fVar12 * (1.0 / fVar4);
      }
      local_368 = local_490;
      local_36c = local_6f0;
      lVar10 = *local_490 + (long)*(int *)((long)local_490 + 0x2c) * (long)local_6f0 * local_490[2];
      for (local_83c = 0; local_83c < local_4c0; local_83c = local_83c + 1) {
        local_378 = &local_508;
        local_37c = local_83c;
        pfVar9 = (float *)((long)local_508 + (long)local_4dc * (long)local_83c * local_4f8);
        fVar11 = pfVar9[1];
        fVar12 = pfVar9[2];
        fVar14 = pfVar9[3];
        fVar13 = expf(-*pfVar9);
        fVar11 = expf(-fVar11);
        fVar12 = expf(-fVar12);
        fVar14 = tanhf(fVar14);
        local_130 = (long)local_83c;
        fVar11 = (1.0 / (fVar11 + 1.0)) * *(float *)(*in_stack_00000028 + local_130 * 4) +
                 (1.0 / (fVar13 + 1.0)) * fVar14;
        fVar14 = tanhf(fVar11);
        fVar14 = (1.0 / (fVar12 + 1.0)) * fVar14;
        local_140 = (long)local_83c;
        *(float *)(*in_stack_00000028 + local_140 * 4) = fVar11;
        if (local_4bc == local_4c0) {
          local_150 = (long)local_83c;
          *(float *)(*in_stack_00000020 + local_150 * 4) = fVar14;
          *(float *)(lVar10 + (long)local_83c * 4) = fVar14;
        }
        else {
          local_160 = (long)local_83c;
          local_158 = &local_560;
          *(float *)((long)local_560 + local_160 * 4) = fVar14;
        }
      }
      if (local_4bc != local_4c0) {
        for (local_864 = 0; local_864 < local_4bc; local_864 = local_864 + 1) {
          local_3fc = local_864;
          local_874 = 0.0;
          for (local_878 = 0; local_878 < local_4c0; local_878 = local_878 + 1) {
            local_170 = (long)local_878;
            local_168 = &local_560;
            local_874 = *(float *)((long)local_560 + local_170 * 4) *
                        *(float *)(*in_stack_00000018 +
                                   (long)*(int *)((long)in_stack_00000018 + 0x2c) * (long)local_864
                                   * in_stack_00000018[2] + (long)local_878 * 4) + local_874;
          }
          local_180 = (long)local_864;
          *(float *)(*in_stack_00000020 + local_180 * 4) = local_874;
          *(float *)(lVar10 + (long)local_864 * 4) = local_874;
        }
      }
    }
    local_47c = 0;
    local_518 = 1;
    local_470 = &local_6e8;
    local_298 = local_470;
    if (local_6e0 != (int *)0x0) {
      local_29c = 0xffffffff;
      LOCK();
      local_2a0 = *local_6e0;
      *local_6e0 = *local_6e0 + -1;
      UNLOCK();
      if (local_2a0 == 1) {
        if (local_6c8 == (long *)0x0) {
          local_290 = local_6e8;
          if (local_6e8 != (float *)0x0) {
            free(local_6e8);
          }
        }
        else {
          (**(code **)(*local_6c8 + 0x18))(local_6c8,local_6e8);
        }
      }
    }
    local_6e8 = (float *)0x0;
    local_6d8 = 0;
    local_6d0 = 0;
    local_6c0 = 0;
    local_6bc = 0;
    local_6b8 = 0;
    local_6b4 = 0;
    local_6b0 = 0;
    local_6a8 = 0;
    local_6e0 = (int *)0x0;
    local_460 = &local_6a0;
    local_2b8 = local_460;
    if (local_698 != (int *)0x0) {
      local_2bc = 0xffffffff;
      LOCK();
      local_2c0 = *local_698;
      *local_698 = *local_698 + -1;
      UNLOCK();
      if (local_2c0 == 1) {
        if (local_680 == (long *)0x0) {
          local_280 = local_6a0;
          if (local_6a0 != (void *)0x0) {
            free(local_6a0);
          }
        }
        else {
          (**(code **)(*local_680 + 0x18))(local_680,local_6a0);
        }
      }
    }
    local_6a0 = (void *)0x0;
    local_690 = 0;
    local_688 = 0;
    local_678 = 0;
    local_674 = 0;
    local_670 = 0;
    local_66c = 0;
    local_668 = 0;
    local_660 = 0;
    local_698 = (int *)0x0;
    local_450 = &local_5f0;
    local_2d8 = local_450;
    if (local_5e8 != (int *)0x0) {
      local_2dc = 0xffffffff;
      LOCK();
      local_2e0 = *local_5e8;
      *local_5e8 = *local_5e8 + -1;
      UNLOCK();
      if (local_2e0 == 1) {
        if (local_5d0 == (long *)0x0) {
          local_270 = local_5f0;
          if (local_5f0 != (void *)0x0) {
            free(local_5f0);
          }
        }
        else {
          (**(code **)(*local_5d0 + 0x18))(local_5d0,local_5f0);
        }
      }
    }
    local_5f0 = (void *)0x0;
    local_5e0 = 0;
    local_5d8 = 0;
    local_5c8 = 0;
    local_5c4 = 0;
    local_5c0 = 0;
    local_5bc = 0;
    local_5b8 = 0;
    local_5b0 = 0;
    local_5e8 = (int *)0x0;
    local_440 = &local_5a8;
    local_2f8 = local_440;
    if (local_5a0 != (int *)0x0) {
      local_2fc = 0xffffffff;
      LOCK();
      local_300 = *local_5a0;
      *local_5a0 = *local_5a0 + -1;
      UNLOCK();
      if (local_300 == 1) {
        if (local_588 == (long *)0x0) {
          local_260 = local_5a8;
          if (local_5a8 != (void *)0x0) {
            free(local_5a8);
          }
        }
        else {
          (**(code **)(*local_588 + 0x18))(local_588,local_5a8);
        }
      }
    }
    local_5a8 = (void *)0x0;
    local_598 = 0;
    local_590 = 0;
    local_580 = 0;
    local_57c = 0;
    local_578 = 0;
    local_574 = 0;
    local_570 = 0;
    local_568 = 0;
    local_5a0 = (int *)0x0;
  }
  else {
    Mat::create(in_stack_fffffffffffff590,(int)((ulong)in_stack_fffffffffffff588 >> 0x20),
                (size_t)in_stack_fffffffffffff580,in_stack_fffffffffffff578);
    local_410 = &local_560;
    if (local_560 != (void *)0x0) {
      local_228 = local_410;
    }
    if (local_560 != (void *)0x0 && local_520 * local_528 != 0) goto LAB_01072ec0;
    local_47c = -100;
    local_518 = 1;
  }
  ppvVar16 = &local_560;
  local_430 = ppvVar16;
  local_318 = ppvVar16;
  if (local_558 != (int *)0x0) {
    local_31c = 0xffffffff;
    LOCK();
    local_320 = *local_558;
    *local_558 = *local_558 + -1;
    UNLOCK();
    if (local_320 == 1) {
      if (local_540 == (long *)0x0) {
        local_250 = local_560;
        if (local_560 != (void *)0x0) {
          free(local_560);
        }
      }
      else {
        (**(code **)(*local_540 + 0x18))(local_540,local_560);
      }
    }
  }
  *ppvVar16 = (void *)0x0;
  ppvVar16[2] = (void *)0x0;
  *(undefined4 *)(ppvVar16 + 3) = 0;
  *(undefined4 *)(ppvVar16 + 5) = 0;
  *(undefined4 *)((long)ppvVar16 + 0x2c) = 0;
  *(undefined4 *)(ppvVar16 + 6) = 0;
  *(undefined4 *)((long)ppvVar16 + 0x34) = 0;
  *(undefined4 *)(ppvVar16 + 7) = 0;
  ppvVar16[8] = (void *)0x0;
  ppvVar16[1] = (void *)0x0;
LAB_010754e2:
  ppvVar16 = &local_508;
  if (local_500 != (int *)0x0) {
    local_33c = 0xffffffff;
    LOCK();
    local_340 = *local_500;
    *local_500 = *local_500 + -1;
    UNLOCK();
    if (local_340 == 1) {
      local_420 = ppvVar16;
      local_338 = ppvVar16;
      if (local_4e8 == (long *)0x0) {
        local_240 = local_508;
        if (local_508 != (void *)0x0) {
          free(local_508);
        }
      }
      else {
        (**(code **)(*local_4e8 + 0x18))(local_4e8,local_508);
      }
    }
  }
  *ppvVar16 = (void *)0x0;
  ppvVar16[2] = (void *)0x0;
  *(undefined4 *)(ppvVar16 + 3) = 0;
  *(undefined4 *)(ppvVar16 + 5) = 0;
  *(undefined4 *)((long)ppvVar16 + 0x2c) = 0;
  *(undefined4 *)(ppvVar16 + 6) = 0;
  *(undefined4 *)((long)ppvVar16 + 0x34) = 0;
  *(undefined4 *)(ppvVar16 + 7) = 0;
  ppvVar16[8] = (void *)0x0;
  ppvVar16[1] = (void *)0x0;
  return local_47c;
}

Assistant:

static int lstm_int8(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc_int8, const float* weight_xc_int8_scales, const Mat& bias_c, const Mat& weight_hc_int8, const float* weight_hc_int8_scales, const Mat& weight_hr, Mat& hidden_state, Mat& cell_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;
    int hidden_size = cell_state.w;

    // 4 x hidden_size
    Mat gates(4, hidden_size, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    Mat tmp_hidden_state;
    if (num_output != hidden_size)
    {
        tmp_hidden_state.create(hidden_size, 4u, opt.workspace_allocator);
        if (tmp_hidden_state.empty())
            return -100;
    }

    // dynamic quantize bottom_blob
    Mat bottom_blob_int8(size, T, (size_t)1u, 1, opt.workspace_allocator);
    Mat bottom_blob_int8_scales(T, (size_t)4u, 1, opt.workspace_allocator);
    {
        for (int t = 0; t < T; t++)
        {
            const float* x = bottom_blob.row(t);

            float absmax = 0.f;
            for (int i = 0; i < size; i++)
            {
                absmax = std::max(absmax, (float)fabs(x[i]));
            }

            bottom_blob_int8_scales[t] = 127.f / absmax;
        }

        Option opt_quant = opt;
        opt_quant.blob_allocator = opt.workspace_allocator;
        opt_quant.use_packing_layout = false;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_quant);
    }

    Mat hidden_state_int8(num_output, (size_t)1u, 1, opt.workspace_allocator);
    Mat hidden_state_int8_scales(1, (size_t)4u, 1, opt.workspace_allocator);

    // unroll
    for (int t = 0; t < T; t++)
    {
        // clip hidden by continuation indicator
        // h_cont_{t-1} = cont_t * h_{t-1}
        // h_cont_{t-1} = h_{t-1} if cont_t == 1
        //                0       otherwise
        // calculate hidden
        // gate_input_t := W_hc * h_conted_{t-1} + W_xc * x_t + b_c

        int ti = reverse ? T - 1 - t : t;

        // dynamic quantize hidden_state
        {
            float absmax = 0.f;
            for (int i = 0; i < num_output; i++)
            {
                absmax = std::max(absmax, (float)fabs(hidden_state[i]));
            }

            if (absmax == 0.f)
            {
                hidden_state_int8_scales[0] = 1.f;
                hidden_state_int8.fill<signed char>(0);
            }
            else
            {
                hidden_state_int8_scales[0] = 127.f / absmax;

                Option opt_quant = opt;
                opt_quant.blob_allocator = opt.workspace_allocator;
                opt_quant.use_packing_layout = false;
                quantize_to_int8(hidden_state, hidden_state_int8, hidden_state_int8_scales, opt_quant);
            }
        }

        const signed char* x = bottom_blob_int8.row<const signed char>(ti);
        const signed char* hs = hidden_state_int8;
        const float descale_x = 1.f / bottom_blob_int8_scales[ti];
        const float descale_h = 1.f / hidden_state_int8_scales[0];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < hidden_size; q++)
        {
            const float* bias_c_I = bias_c.row(0);
            const float* bias_c_F = bias_c.row(1);
            const float* bias_c_O = bias_c.row(2);
            const float* bias_c_G = bias_c.row(3);

            float* gates_data = gates.row(q);

            // gate I F O G
            const signed char* weight_xc_int8_I = weight_xc_int8.row<const signed char>(hidden_size * 0 + q);
            const signed char* weight_xc_int8_F = weight_xc_int8.row<const signed char>(hidden_size * 1 + q);
            const signed char* weight_xc_int8_O = weight_xc_int8.row<const signed char>(hidden_size * 2 + q);
            const signed char* weight_xc_int8_G = weight_xc_int8.row<const signed char>(hidden_size * 3 + q);

            const signed char* weight_hc_int8_I = weight_hc_int8.row<const signed char>(hidden_size * 0 + q);
            const signed char* weight_hc_int8_F = weight_hc_int8.row<const signed char>(hidden_size * 1 + q);
            const signed char* weight_hc_int8_O = weight_hc_int8.row<const signed char>(hidden_size * 2 + q);
            const signed char* weight_hc_int8_G = weight_hc_int8.row<const signed char>(hidden_size * 3 + q);

            const float descale_xc_I = 1.f / weight_xc_int8_scales[hidden_size * 0 + q];
            const float descale_xc_F = 1.f / weight_xc_int8_scales[hidden_size * 1 + q];
            const float descale_xc_O = 1.f / weight_xc_int8_scales[hidden_size * 2 + q];
            const float descale_xc_G = 1.f / weight_xc_int8_scales[hidden_size * 3 + q];
            const float descale_hc_I = 1.f / weight_hc_int8_scales[hidden_size * 0 + q];
            const float descale_hc_F = 1.f / weight_hc_int8_scales[hidden_size * 1 + q];
            const float descale_hc_O = 1.f / weight_hc_int8_scales[hidden_size * 2 + q];
            const float descale_hc_G = 1.f / weight_hc_int8_scales[hidden_size * 3 + q];

            int Ix = 0;
            int Fx = 0;
            int Ox = 0;
            int Gx = 0;
            for (int i = 0; i < size; i++)
            {
                signed char xi = x[i];

                Ix += weight_xc_int8_I[i] * xi;
                Fx += weight_xc_int8_F[i] * xi;
                Ox += weight_xc_int8_O[i] * xi;
                Gx += weight_xc_int8_G[i] * xi;
            }

            int Ih = 0;
            int Fh = 0;
            int Oh = 0;
            int Gh = 0;
            for (int i = 0; i < num_output; i++)
            {
                signed char h_cont = hs[i];

                Ih += weight_hc_int8_I[i] * h_cont;
                Fh += weight_hc_int8_F[i] * h_cont;
                Oh += weight_hc_int8_O[i] * h_cont;
                Gh += weight_hc_int8_G[i] * h_cont;
            }

            float I = bias_c_I[q] + Ix * (descale_x * descale_xc_I) + Ih * (descale_h * descale_hc_I);
            float F = bias_c_F[q] + Fx * (descale_x * descale_xc_F) + Fh * (descale_h * descale_hc_F);
            float O = bias_c_O[q] + Ox * (descale_x * descale_xc_O) + Oh * (descale_h * descale_hc_O);
            float G = bias_c_G[q] + Gx * (descale_x * descale_xc_G) + Gh * (descale_h * descale_hc_G);

            gates_data[0] = I;
            gates_data[1] = F;
            gates_data[2] = O;
            gates_data[3] = G;
        }

        // lstm unit
        // sigmoid(I)
        // sigmoid(F)
        // sigmoid(O)
        // tanh(G)
        // c_t := f_t .* c_{t-1} + i_t .* g_t
        // h_t := o_t .* tanh[c_t]
        float* output_data = top_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < hidden_size; q++)
        {
            const float* gates_data = gates.row(q);

            float I = gates_data[0];
            float F = gates_data[1];
            float O = gates_data[2];
            float G = gates_data[3];

            I = 1.f / (1.f + expf(-I));
            F = 1.f / (1.f + expf(-F));
            O = 1.f / (1.f + expf(-O));
            G = tanhf(G);

            float cell2 = F * cell_state[q] + I * G;
            float H = O * tanhf(cell2);
            cell_state[q] = cell2;

            if (num_output == hidden_size)
            {
                hidden_state[q] = H;
                output_data[q] = H;
            }
            else
            {
                tmp_hidden_state[q] = H;
            }
        }

        if (num_output != hidden_size)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < num_output; q++)
            {
                const float* hr = weight_hr.row(q);

                float H = 0;
                for (int i = 0; i < hidden_size; i++)
                {
                    H += tmp_hidden_state[i] * hr[i];
                }

                hidden_state[q] = H;
                output_data[q] = H;
            }
        }
    }

    return 0;
}